

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_error.cpp
# Opt level: O0

void __thiscall pfederc::Parser::sanityExpect(Parser *this,TokenType type)

{
  bool bVar1;
  Token *this_00;
  allocator<char> local_39;
  string local_38;
  TokenType local_12;
  Parser *pPStack_10;
  TokenType type_local;
  Parser *this_local;
  
  local_12 = type;
  pPStack_10 = this;
  this_00 = Lexer::getCurrentToken(this->lexer);
  bVar1 = Token::operator!=(this_00,local_12);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"Unexpected token",&local_39);
    fatal("syntax_error.cpp",6,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
  }
  else {
    Lexer::next(this->lexer);
  }
  return;
}

Assistant:

void Parser::sanityExpect(TokenType type) noexcept {
  if (*lexer.getCurrentToken() != type) {
    fatal("syntax_error.cpp", __LINE__, "Unexpected token");
    return;
  }

  lexer.next();
}